

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkImageScaler::NeuralNetworkImageScaler
          (NeuralNetworkImageScaler *this,NeuralNetworkImageScaler *from)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__NeuralNetworkImageScaler_006fe6f8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->redbias_ = from->redbias_;
  fVar2 = from->channelscale_;
  fVar3 = from->bluebias_;
  fVar4 = from->greenbias_;
  this->graybias_ = from->graybias_;
  this->channelscale_ = fVar2;
  this->bluebias_ = fVar3;
  this->greenbias_ = fVar4;
  return;
}

Assistant:

NeuralNetworkImageScaler::NeuralNetworkImageScaler(const NeuralNetworkImageScaler& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&graybias_, &from.graybias_,
    reinterpret_cast<char*>(&redbias_) -
    reinterpret_cast<char*>(&graybias_) + sizeof(redbias_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NeuralNetworkImageScaler)
}